

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Product.cpp
# Opt level: O2

string * __thiscall Product::getName_abi_cxx11_(string *__return_storage_ptr__,Product *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

string Product::getName() const{
    return name;
}